

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void text_sequence_doit(t_text_sequence *x,int argc,t_atom *argv)

{
  t_atomtype tVar1;
  uint uVar2;
  char *pcVar3;
  _outlet *p_Var4;
  t_pd p_Var5;
  undefined4 uVar6;
  int ac;
  t_text_sequence *ptVar7;
  int iVar8;
  t_atom *ptVar9;
  t_symbol *ptVar10;
  _binbuf *p_Var11;
  long lVar12;
  t_atom *ptVar13;
  t_atom *ptVar14;
  t_atom tStack_c8;
  undefined1 auStack_b8 [15];
  undefined1 local_a9;
  t_symbol *local_a8;
  t_atom *local_a0;
  bool local_97;
  bool local_96;
  bool local_95;
  int local_94;
  t_atom *ptStack_90;
  int nleft;
  t_atom *vecleft;
  t_pd *to;
  t_symbol *tosym;
  t_symbol *ptStack_70;
  int n2;
  t_symbol *s;
  int atno;
  int type;
  t_atom *ap;
  t_atom *outvec;
  t_atom *vec;
  int local_40;
  int gotcomma;
  int eatsemi;
  int wait;
  int nfield;
  int onset;
  int i;
  int n;
  _binbuf *b;
  t_atom *argv_local;
  t_text_sequence *ptStack_10;
  int argc_local;
  t_text_sequence *x_local;
  
  ptVar13 = (t_atom *)auStack_b8;
  tStack_c8.a_w.w_symbol = (t_symbol *)0x1d3eaf;
  b = (_binbuf *)argv;
  argv_local._4_4_ = argc;
  ptStack_10 = x;
  _i = text_client_getbuf(&x->x_tc);
  local_40 = 1;
  vec._4_4_ = 0;
  if (_i != (_binbuf *)0x0) {
    tStack_c8.a_w.w_symbol = (t_symbol *)0x1d3ed3;
    outvec = binbuf_getvec(_i);
    tStack_c8.a_w.w_symbol = (t_symbol *)0x1d3ee0;
    onset = binbuf_getnatom(_i);
    if (ptStack_10->x_onset < onset) {
      wait = ptStack_10->x_onset;
      nfield = wait;
      if ((ptStack_10->x_lastto == (t_symbol *)0x0) &&
         ((((outvec[wait].a_type == A_FLOAT && (ptStack_10->x_waitargc != 0)) &&
           (ptStack_10->x_eaten == '\0')) ||
          ((outvec[wait].a_type == A_SYMBOL && (outvec[wait].a_w.w_symbol == ptStack_10->x_waitsym))
          )))) {
        if (outvec[wait].a_type == A_FLOAT) {
          while( true ) {
            local_95 = false;
            if ((nfield < onset) && (local_95 = false, nfield < wait + ptStack_10->x_waitargc)) {
              local_95 = outvec[nfield].a_type == A_FLOAT;
            }
            if (local_95 == false) break;
            nfield = nfield + 1;
          }
          ptStack_10->x_eaten = '\x01';
          local_40 = 0;
        }
        else {
          while( true ) {
            local_96 = false;
            if ((nfield < onset) && (local_96 = false, outvec[nfield].a_type != A_SEMI)) {
              local_96 = outvec[nfield].a_type != A_COMMA;
            }
            if (local_96 == false) break;
            nfield = nfield + 1;
          }
          ptStack_10->x_eaten = '\x01';
          wait = wait + 1;
        }
        gotcomma = 1;
      }
      else {
        while( true ) {
          local_97 = false;
          if ((nfield < onset) && (local_97 = false, outvec[nfield].a_type != A_SEMI)) {
            local_97 = outvec[nfield].a_type != A_COMMA;
          }
          if (local_97 == false) break;
          nfield = nfield + 1;
        }
        gotcomma = 0;
        ptStack_10->x_eaten = '\0';
        if ((nfield < onset) && (outvec[nfield].a_type == A_COMMA)) {
          vec._4_4_ = 1;
        }
      }
      eatsemi = nfield - wait;
      nfield = local_40 + nfield;
      if (onset <= nfield) {
        nfield = 0x7fffffff;
      }
      ptStack_10->x_onset = nfield;
      if (eatsemi + 1 < 100) {
        ptVar13 = &tStack_c8 + -(long)eatsemi;
        local_a0 = ptVar13;
      }
      else {
        tStack_c8.a_w.w_symbol = (t_symbol *)0x1d41c2;
        local_a0 = (t_atom *)getbytes((long)(eatsemi + 1) << 4);
      }
      ap = local_a0;
      _atno = outvec + wait;
      for (nfield = 0; ptVar7 = ptStack_10, ac = argv_local._4_4_, p_Var11 = b, iVar8 = eatsemi,
          ptVar9 = ap, nfield < eatsemi; nfield = nfield + 1) {
        tVar1 = _atno->a_type;
        s._4_4_ = tVar1;
        if ((tVar1 == A_FLOAT) || (tVar1 == A_SYMBOL)) {
          ptVar9 = ap + nfield;
          uVar6 = *(undefined4 *)&_atno->field_0x4;
          ptVar9->a_type = _atno->a_type;
          *(undefined4 *)&ptVar9->field_0x4 = uVar6;
          ptVar9->a_w = _atno->a_w;
        }
        else if (tVar1 == A_DOLLAR) {
          uVar2 = (_atno->a_w).w_index;
          s._0_4_ = uVar2 - 1;
          if (((int)s < 0) || (argv_local._4_4_ <= (int)s)) {
            ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d4272;
            pd_error(ptVar7,"argument $%d out of range",(ulong)uVar2);
            ap[nfield].a_type = A_FLOAT;
            ap[nfield].a_w.w_float = 0.0;
          }
          else {
            ptVar9 = ap + nfield;
            p_Var11 = b + (int)s;
            uVar6 = *(undefined4 *)&p_Var11->field_0x4;
            ptVar9->a_type = p_Var11->b_n;
            *(undefined4 *)&ptVar9->field_0x4 = uVar6;
            ptVar9->a_w = (word)p_Var11->b_vec;
          }
        }
        else if (tVar1 == A_DOLLSYM) {
          ptVar10 = (_atno->a_w).w_symbol;
          ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d42f1;
          ptVar10 = binbuf_realizedollsym(ptVar10,ac,(t_atom *)p_Var11,0);
          ptStack_70 = ptVar10;
          if (ptVar10 == (t_symbol *)0x0) {
            pcVar3 = ((_atno->a_w).w_symbol)->s_name;
            ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d4347;
            pd_error((void *)0x0,"$%s: not enough arguments supplied",pcVar3);
            ap[nfield].a_type = A_SYMBOL;
            ap[nfield].a_w.w_symbol = &s_symbol;
          }
          else {
            ap[nfield].a_type = A_SYMBOL;
            ap[nfield].a_w.w_symbol = ptVar10;
          }
        }
        else {
          ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d4386;
          bug("text sequence");
        }
        _atno = _atno + 1;
      }
      if (gotcomma == 0) {
        if (ptStack_10->x_mainout == (_outlet *)0x0) {
          if (eatsemi != 0) {
            to = (t_pd *)ptStack_10->x_lastto;
            vecleft = (t_atom *)0x0;
            ptStack_90 = ap;
            local_94 = eatsemi;
            if ((t_symbol *)to == (t_symbol *)0x0) {
              if (ap->a_type == A_SYMBOL) {
                to = (t_pd *)(ap->a_w).w_symbol;
              }
              else {
                ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d4560;
                bug("text sequence 2");
              }
              ptStack_90 = ptStack_90 + 1;
              local_94 = local_94 + -1;
            }
            ptVar7 = ptStack_10;
            if ((to != (t_pd *)0x0) && (vecleft = (t_atom *)to[1], (t_pd)vecleft == (t_pd)0x0)) {
              p_Var5 = *to;
              ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d45c1;
              pd_error(ptVar7,"%s: no such object",p_Var5);
            }
            ptVar14 = vecleft;
            ptVar9 = ptStack_90;
            iVar8 = local_94;
            if (vec._4_4_ == 0) {
              local_a8 = (t_symbol *)0x0;
            }
            else {
              local_a8 = (t_symbol *)to;
            }
            ptStack_10->x_lastto = local_a8;
            if (vecleft != (t_atom *)0x0) {
              if ((local_94 < 1) || (ptStack_90->a_type != A_SYMBOL)) {
                ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d4653;
                pd_list((t_pd *)ptVar14,(t_symbol *)0x0,iVar8,ptVar9);
              }
              else {
                ptVar10 = (ptStack_90->a_w).w_symbol;
                iVar8 = local_94 + -1;
                ptVar9 = ptStack_90 + 1;
                ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d4637;
                pd_typedmess((t_pd *)ptVar14,ptVar10,iVar8,ptVar9);
              }
            }
          }
        }
        else {
          tosym._4_4_ = eatsemi;
          if (ptStack_10->x_lastto != (t_symbol *)0x0) {
            ptVar14 = ap + 1;
            lVar12 = (long)eatsemi;
            ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d4481;
            memmove(ptVar14,ptVar9,lVar12 << 4);
            ap->a_type = A_SYMBOL;
            ap->a_w = (word)ptStack_10->x_lastto;
            tosym._4_4_ = tosym._4_4_ + 1;
          }
          ptVar9 = ap;
          iVar8 = tosym._4_4_;
          if (vec._4_4_ == 0) {
            ptStack_10->x_lastto = (t_symbol *)0x0;
          }
          else if (((ptStack_10->x_lastto == (t_symbol *)0x0) && (eatsemi != 0)) &&
                  (ap->a_type == A_SYMBOL)) {
            ptStack_10->x_lastto = (t_symbol *)ap->a_w;
          }
          p_Var4 = ptStack_10->x_mainout;
          ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d4508;
          outlet_list(p_Var4,(t_symbol *)0x0,iVar8,ptVar9);
        }
      }
      else {
        ptStack_10->x_loop = '\0';
        ptStack_10->x_lastto = (t_symbol *)0x0;
        if (((ptStack_10->x_auto == '\0') || (eatsemi != 1)) || (ap->a_type != A_FLOAT)) {
          if (ptStack_10->x_waitout == (_outlet *)0x0) {
            ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d4419;
            bug("text sequence 3");
          }
          else {
            ptStack_10->x_auto = '\0';
            p_Var4 = ptStack_10->x_waitout;
            ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d443e;
            outlet_list(p_Var4,(t_symbol *)0x0,iVar8,ptVar9);
          }
        }
        else {
          ptStack_10->x_nextdelay = (ap->a_w).w_float;
        }
      }
      ptVar9 = ap;
      local_a9 = 1;
      if (eatsemi + 1 < 100) {
        return;
      }
      iVar8 = eatsemi + 1;
      ptVar13[-1].a_w.w_symbol = (t_symbol *)0x1d4684;
      freebytes(ptVar9,(long)iVar8 << 4);
      return;
    }
  }
  ptStack_10->x_onset = 0x7fffffff;
  ptStack_10->x_auto = '\0';
  ptStack_10->x_loop = '\0';
  tStack_c8.a_w.w_symbol = (t_symbol *)0x1d3f1f;
  outlet_bang(ptStack_10->x_endout);
  return;
}

Assistant:

static void text_sequence_doit(t_text_sequence *x, int argc, t_atom *argv)
{
    t_binbuf *b = text_client_getbuf(&x->x_tc);
    int n, i, onset, nfield, wait, eatsemi = 1, gotcomma = 0;
    t_atom *vec, *outvec, *ap;
    if (!b)
        goto nosequence;
    vec = binbuf_getvec(b);
    n = binbuf_getnatom(b);
    if (x->x_onset >= n)
    {
    nosequence:
        x->x_onset = 0x7fffffff;
        x->x_loop = x->x_auto = 0;
        outlet_bang(x->x_endout);
        return;
    }
    onset = x->x_onset;

        /* test if leading numbers, or a leading symbol equal to our
        "wait symbol", are directing us to wait */
    if (!x->x_lastto && (
        (vec[onset].a_type == A_FLOAT && x->x_waitargc && !x->x_eaten) ||
            (vec[onset].a_type == A_SYMBOL &&
                vec[onset].a_w.w_symbol == x->x_waitsym)))
    {
        if (vec[onset].a_type == A_FLOAT)
        {
            for (i = onset; i < n && i < onset + x->x_waitargc &&
                vec[i].a_type == A_FLOAT; i++)
                    ;
            x->x_eaten = 1;
            eatsemi = 0;
        }
        else
        {
            for (i = onset; i < n && vec[i].a_type != A_SEMI &&
                vec[i].a_type != A_COMMA; i++)
                    ;
            x->x_eaten = 1;
            onset++;    /* symbol isn't part of wait list */
        }
        wait = 1;
    }
    else    /* message to send */
    {
        for (i = onset; i < n && vec[i].a_type != A_SEMI &&
            vec[i].a_type != A_COMMA; i++)
                ;
        wait = 0;
        x->x_eaten = 0;
        if (i < n && vec[i].a_type == A_COMMA)
            gotcomma = 1;
    }
    nfield = i - onset;
    i += eatsemi;
    if (i >= n)
        i = 0x7fffffff;
    x->x_onset = i;
        /* generate output list, realizing dolar sign atoms.  Allocate one
        extra atom in case we want to prepend a symbol later */
    ATOMS_ALLOCA(outvec, nfield+1);
    for (i = 0, ap = vec+onset; i < nfield; i++, ap++)
    {
        int type = ap->a_type;
        if (type == A_FLOAT || type == A_SYMBOL)
            outvec[i] = *ap;
        else if (type == A_DOLLAR)
        {
            int atno = ap->a_w.w_index-1;
            if (atno < 0 || atno >= argc)
            {
                pd_error(x, "argument $%d out of range", atno+1);
                SETFLOAT(outvec+i, 0);
            }
            else outvec[i] = argv[atno];
        }
        else if (type == A_DOLLSYM)
        {
            t_symbol *s =
                binbuf_realizedollsym(ap->a_w.w_symbol, argc, argv, 0);
            if (s)
                SETSYMBOL(outvec+i, s);
            else
            {
                pd_error(0, "$%s: not enough arguments supplied",
                    ap->a_w.w_symbol->s_name);
                SETSYMBOL(outvec+i, &s_symbol);
            }
        }
        else bug("text sequence");
    }
    if (wait)
    {
        x->x_loop = 0;
        x->x_lastto = 0;
        if (x->x_auto && nfield == 1 && outvec[0].a_type == A_FLOAT)
            x->x_nextdelay = outvec[0].a_w.w_float;
        else if (!x->x_waitout)
            bug("text sequence 3");
        else
        {
            x->x_auto = 0;
            outlet_list(x->x_waitout, 0, nfield, outvec);
        }
    }
    else if (x->x_mainout)
    {
        int n2 = nfield;
        if (x->x_lastto)
        {
            memmove(outvec+1, outvec, nfield * sizeof(*outvec));
            SETSYMBOL(outvec, x->x_lastto);
            n2++;
        }
        if (!gotcomma)
            x->x_lastto = 0;
        else if (!x->x_lastto && nfield && outvec->a_type == A_SYMBOL)
            x->x_lastto = outvec->a_w.w_symbol;
        outlet_list(x->x_mainout, 0, n2, outvec);
    }
    else if (nfield)
    {
        t_symbol *tosym = x->x_lastto;
        t_pd *to = 0;
        t_atom *vecleft = outvec;
        int nleft = nfield;
        if (!tosym)
        {
            if (outvec[0].a_type != A_SYMBOL)
                bug("text sequence 2");
            else tosym = outvec[0].a_w.w_symbol;
            vecleft++;
            nleft--;
        }
        if (tosym)
        {
            if (!(to = tosym->s_thing))
                pd_error(x, "%s: no such object", tosym->s_name);
        }
        x->x_lastto = (gotcomma ? tosym : 0);
        if (to)
        {
            if (nleft > 0 && vecleft[0].a_type == A_SYMBOL)
                typedmess(to, vecleft->a_w.w_symbol, nleft-1, vecleft+1);
            else pd_list(to, 0, nleft, vecleft);
        }
    }
    ATOMS_FREEA(outvec, nfield+1);
}